

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O0

void __thiscall Assimp::FBX::AnimationCurve::~AnimationCurve(AnimationCurve *this)

{
  AnimationCurve *this_local;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurve_00ecb220;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->flags);
  std::vector<float,_std::allocator<float>_>::~vector(&this->attributes);
  std::vector<float,_std::allocator<float>_>::~vector(&this->values);
  std::vector<long,_std::allocator<long>_>::~vector(&this->keys);
  FBX::Object::~Object(&this->super_Object);
  return;
}

Assistant:

AnimationCurve::~AnimationCurve()
{
    // empty
}